

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_bool32 ma_dr_flac__read_and_decode_next_flac_frame(ma_dr_flac *pFlac)

{
  bool bVar1;
  ma_bool32 mVar2;
  ma_result mVar3;
  ma_bool32 unaff_EBP;
  
  do {
    mVar2 = ma_dr_flac__read_next_flac_frame_header
                      (&pFlac->bs,pFlac->bitsPerSample,&(pFlac->currentFLACFrame).header);
    bVar1 = true;
    if (mVar2 == 0) {
LAB_00157998:
      unaff_EBP = 0;
    }
    else {
      mVar3 = ma_dr_flac__decode_flac_frame(pFlac);
      if (mVar3 == MA_CRC_MISMATCH) {
        bVar1 = false;
      }
      else {
        if (mVar3 != MA_SUCCESS) goto LAB_00157998;
        unaff_EBP = 1;
      }
    }
    if (bVar1) {
      return unaff_EBP;
    }
  } while( true );
}

Assistant:

static ma_bool32 ma_dr_flac__read_and_decode_next_flac_frame(ma_dr_flac* pFlac)
{
    MA_DR_FLAC_ASSERT(pFlac != NULL);
    for (;;) {
        ma_result result;
        if (!ma_dr_flac__read_next_flac_frame_header(&pFlac->bs, pFlac->bitsPerSample, &pFlac->currentFLACFrame.header)) {
            return MA_FALSE;
        }
        result = ma_dr_flac__decode_flac_frame(pFlac);
        if (result != MA_SUCCESS) {
            if (result == MA_CRC_MISMATCH) {
                continue;
            } else {
                return MA_FALSE;
            }
        }
        return MA_TRUE;
    }
}